

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O3

bool qputenv(char *varName,QByteArrayView raw)

{
  QBasicMutex copy;
  int iVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = "";
  if (raw.m_data != (char *)0x0) {
    pcVar2 = raw.m_data;
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  uStack_28 = 0xaaaaaaaa;
  uStack_24 = 0xaaaaaaaa;
  local_38 = (char *)&uStack_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar2,pcVar2 + raw.m_size);
  if ((AtomicType)environmentMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    environmentMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
  }
  else {
    QBasicMutex::lockInternal(&environmentMutex);
  }
  iVar1 = setenv(varName,local_38,1);
  copy = environmentMutex;
  LOCK();
  environmentMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
    QBasicMutex::unlockInternalFutex(&environmentMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
  }
  if (local_38 != (char *)&uStack_28) {
    operator_delete(local_38,CONCAT44(uStack_24,uStack_28) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return iVar1 == 0;
}

Assistant:

bool qputenv(const char *varName, QByteArrayView raw)
{
    auto protect = [](const char *str) { return str ? str : ""; };

    std::string value{protect(raw.data()), size_t(raw.size())}; // NUL-terminates w/SSO

#if defined(Q_CC_MSVC)
    const auto locker = qt_scoped_lock(environmentMutex);
    return _putenv_s(varName, value.data()) == 0;
#elif (defined(_POSIX_VERSION) && (_POSIX_VERSION-0) >= 200112L) || defined(Q_OS_HAIKU)
    // POSIX.1-2001 has setenv
    const auto locker = qt_scoped_lock(environmentMutex);
    return setenv(varName, value.data(), true) == 0;
#else
    std::string buffer;
    buffer += protect(varName);
    buffer += '=';
    buffer += value;
    char *envVar = qstrdup(buffer.data());
    int result = [&] {
        const auto locker = qt_scoped_lock(environmentMutex);
        return putenv(envVar);
    }();
    if (result != 0) // error. we have to delete the string.
        delete[] envVar;
    return result == 0;
#endif
}